

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typed_statement.cc
# Opt level: O1

int __thiscall
tchecker::typed_sum_to_clock_assign_statement_t::clone
          (typed_sum_to_clock_assign_statement_t *this,__fn *__fn,void *__child_stack,int __flags,
          void *__arg,...)

{
  typed_lvalue_expression_t *ptVar1;
  typed_expression_t *ptVar2;
  typed_sum_to_clock_assign_statement_t *this_00;
  shared_ptr<const_tchecker::typed_expression_t> rvalue_clone;
  shared_ptr<const_tchecker::typed_lvalue_expression_t> lvalue_clone;
  shared_ptr<const_tchecker::typed_expression_t> local_30;
  shared_ptr<const_tchecker::typed_lvalue_expression_t> local_20;
  
  ptVar1 = typed_assign_statement_t::lvalue(&this->super_typed_assign_statement_t);
  local_20.super___shared_ptr<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)(**(code **)(*(long *)&ptVar1->super_typed_expression_t + 0x28))(ptVar1)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<tchecker::typed_lvalue_expression_t*>
            (&local_20.
              super___shared_ptr<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,
             local_20.
             super___shared_ptr<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr);
  ptVar2 = typed_assign_statement_t::rvalue(&this->super_typed_assign_statement_t);
  local_30.super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)(**(code **)(*(long *)ptVar2 + 0x28))(ptVar2);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<tchecker::typed_expression_t*>
            (&local_30.
              super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             local_30.
             super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  this_00 = (typed_sum_to_clock_assign_statement_t *)operator_new(0x38);
  typed_sum_to_clock_assign_statement_t
            (this_00,(this->super_typed_assign_statement_t).super_typed_statement_t._type,&local_20,
             &local_30);
  if (local_30.super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.
               super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_20.
      super___shared_ptr<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.
               super___shared_ptr<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return (int)this_00;
}

Assistant:

tchecker::typed_sum_to_clock_assign_statement_t * typed_sum_to_clock_assign_statement_t::clone() const
{
  std::shared_ptr<typed_lvalue_expression_t const> lvalue_clone{lvalue().clone()};
  std::shared_ptr<typed_expression_t const> rvalue_clone{rvalue().clone()};
  return new tchecker::typed_sum_to_clock_assign_statement_t{_type, lvalue_clone, rvalue_clone};
}